

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

void __thiscall
duckdb::HashJoinGlobalSourceState::HashJoinGlobalSourceState
          (HashJoinGlobalSourceState *this,PhysicalHashJoin *op,ClientContext *context)

{
  const_reference pvVar1;
  idx_t iVar2;
  
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSourceState)._vptr_GlobalSourceState =
       (_func_int **)&PTR__HashJoinGlobalSourceState_0249e268;
  this->op = op;
  (this->global_stage)._M_i = INIT;
  this->build_chunk_idx = 0xffffffffffffffff;
  this->build_chunk_count = 0;
  this->build_chunk_done = 0;
  this->build_chunks_per_thread = 0xffffffffffffffff;
  (this->probe_chunk_count).super___atomic_base<unsigned_long>._M_i = 0;
  this->probe_chunk_done = 0;
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.children,0);
  this->probe_count = pvVar1->_M_data->estimated_cardinality;
  iVar2 = 0x78;
  if ((context->config).verify_parallelism != false) {
    iVar2 = 1;
  }
  this->parallel_scan_chunk_count = iVar2;
  this->full_outer_chunk_idx = 0xffffffffffffffff;
  this->full_outer_chunks_per_thread = 0xffffffffffffffff;
  (this->blocked_tasks).
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocked_tasks).
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blocked_tasks).
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

HashJoinGlobalSourceState::HashJoinGlobalSourceState(const PhysicalHashJoin &op, const ClientContext &context)
    : op(op), global_stage(HashJoinSourceStage::INIT), build_chunk_count(0), build_chunk_done(0), probe_chunk_count(0),
      probe_chunk_done(0), probe_count(op.children[0].get().estimated_cardinality),
      parallel_scan_chunk_count(context.config.verify_parallelism ? 1 : 120) {
}